

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O1

bool saveToFile<float>(string *fname,TWaveformT<float> *waveform)

{
  int iVar1;
  pointer pfVar2;
  pointer pfVar3;
  ofstream fout;
  long local_218;
  filebuf local_210 [24];
  int aiStack_1f8 [54];
  ios_base local_120 [264];
  
  std::ofstream::ofstream(&local_218,(string *)fname,_S_bin);
  iVar1 = *(int *)((long)aiStack_1f8 + *(long *)(local_218 + -0x18));
  if (iVar1 == 0) {
    pfVar2 = (waveform->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pfVar3 = (waveform->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    std::ostream::write((char *)&local_218,(long)pfVar2);
    std::ofstream::close();
    printf("Total data saved: %g MB\n",
           (double)((float)(ulong)((long)pfVar3 - (long)pfVar2) * 0.0009765625 * 0.0009765625));
  }
  local_218 = _VTT;
  *(undefined8 *)(local_210 + *(long *)(_VTT + -0x18) + -8) = _ceilf;
  std::filebuf::~filebuf(local_210);
  std::ios_base::~ios_base(local_120);
  return iVar1 == 0;
}

Assistant:

bool saveToFile(const std::string & fname, TWaveformT<TSample> & waveform) {
    static_assert(std::is_same<TSample, TSampleF>::value, "Sample type not supported");

    std::ofstream fout(fname, std::ios::binary);
    if (fout.good() == false) {
        return false;
    }

    auto totalSize_bytes = sizeof(TSample)*waveform.size();

    fout.write((char *)(waveform.data()), totalSize_bytes);
    fout.close();

    printf("Total data saved: %g MB\n", ((float)(totalSize_bytes)/1024.0f/1024.0f));

    return true;
}